

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

void __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.cpp:170:38)>
::move(impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_function_object_cpp:170:38)>
       *this,model *to)

{
  to->_vptr_model = (_func_int **)&PTR_destroy_001c7a98;
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)(to + 1),(gc_heap_ptr_untyped *)&this->f);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)(to + 3),&(this->f).bound_args.super_gc_heap_ptr_untyped);
  return;
}

Assistant:

void move(model* to) override { new (to) impl<F>(std::move(*this)); }